

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O3

reference __thiscall
OpenMesh::BaseKernel::property<int>(BaseKernel *this,FPropHandleT<int> _ph,FaceHandle _fh)

{
  pointer piVar1;
  PropertyT<int> *pPVar2;
  
  pPVar2 = PropertyContainer::property<int>
                     (&this->fprops_,_ph.super_BasePropHandleT<int>.super_BaseHandle.idx_);
  piVar1 = (pPVar2->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(long)(int)_fh.super_BaseHandle.idx_ <
      (ulong)((long)(pPVar2->data_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
    return piVar1 + (int)_fh.super_BaseHandle.idx_;
  }
  __assert_fail("size_t(_idx) < data_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Utils/Property.hh"
                ,0xbc,"reference OpenMesh::PropertyT<int>::operator[](int) [T = int]");
}

Assistant:

typename FPropHandleT<T>::reference
  property(FPropHandleT<T> _ph, FaceHandle _fh) {
    return fprops_.property(_ph)[_fh.idx()];
  }